

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FlowGraph.cpp
# Opt level: O1

LabelInstr * __thiscall Loop::GetLoopTopInstr(Loop *this)

{
  IRKind IVar1;
  code *pcVar2;
  bool bVar3;
  BasicBlock *pBVar4;
  undefined4 *puVar5;
  LabelInstr *pLVar6;
  
  if ((this->topFunc->field_0x242 & 4) == 0) {
    pLVar6 = this->loopTopLabel;
  }
  else {
    pBVar4 = GetHeadBlock(this);
    pLVar6 = (LabelInstr *)pBVar4->firstInstr;
    IVar1 = (pLVar6->super_Instr).m_kind;
    if ((IVar1 != InstrKindLabel) && (IVar1 != InstrKindProfiledLabel)) {
      AssertCount = AssertCount + 1;
      Js::Throw::LogAssert();
      puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
      *puVar5 = 1;
      bVar3 = Js::Throw::ReportAssert
                        ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/IR.inl"
                         ,0x7a,"(this->IsLabelInstr())","Bad call to AsLabelInstr()");
      if (!bVar3) goto LAB_0041c74d;
      *puVar5 = 0;
    }
  }
  if ((pLVar6 != (LabelInstr *)0x0) && ((pLVar6->field_0x78 & 1) == 0)) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar5 = (undefined4 *)__tls_get_addr(&PTR_0155fe48);
    *puVar5 = 1;
    bVar3 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/FlowGraph.cpp"
                       ,0xe3e,"(instr->m_isLoopTop)","instr->m_isLoopTop");
    if (!bVar3) {
LAB_0041c74d:
      pcVar2 = (code *)invalidInstructionException();
      (*pcVar2)();
    }
    *puVar5 = 0;
  }
  return pLVar6;
}

Assistant:

IR::LabelInstr *
Loop::GetLoopTopInstr() const
{
    IR::LabelInstr * instr = nullptr;
    if (this->topFunc->isFlowGraphValid)
    {
        instr = this->GetHeadBlock()->GetFirstInstr()->AsLabelInstr();
    }
    else
    {
        // Flowgraph gets torn down after the globopt, so can't get the loopTop from the head block.
        instr = this->loopTopLabel;
    }
    if (instr)
    {
        Assert(instr->m_isLoopTop);
    }
    return instr;
}